

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ur_kin.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  double *T_00;
  int local_1e4;
  int local_1e0;
  int i_2;
  int i_1;
  int num_sols;
  double q_sols [48];
  int j;
  int i;
  double *T;
  double q [6];
  char **argv_local;
  int argc_local;
  
  q[5] = (double)argv;
  memset(&T,0,0x30);
  q[1] = 1.0;
  q[3] = 1.0;
  T_00 = (double *)operator_new__(0x80);
  ur_kinematics::forward((double *)&T,T_00);
  for (q_sols[0x2f]._4_4_ = 0; q_sols[0x2f]._4_4_ < 4; q_sols[0x2f]._4_4_ = q_sols[0x2f]._4_4_ + 1)
  {
    for (q_sols[0x2f]._0_4_ = q_sols[0x2f]._4_4_ << 2;
        q_sols[0x2f]._0_4_ < (q_sols[0x2f]._4_4_ + 1) * 4;
        q_sols[0x2f]._0_4_ = q_sols[0x2f]._0_4_ + 1) {
      printf("%1.3f ",T_00[q_sols[0x2f]._0_4_]);
    }
    printf("\n");
  }
  iVar1 = ur_kinematics::inverse(T_00,(double *)&i_1,0.0);
  for (local_1e0 = 0; local_1e0 < iVar1; local_1e0 = local_1e0 + 1) {
    printf("%1.6f %1.6f %1.6f %1.6f %1.6f %1.6f\n",*(undefined8 *)(&i_1 + (long)(local_1e0 * 6) * 2)
           ,*(undefined8 *)(&i_1 + (long)(local_1e0 * 6 + 1) * 2),
           *(undefined8 *)(&i_1 + (long)(local_1e0 * 6 + 2) * 2),
           *(undefined8 *)(&i_1 + (long)(local_1e0 * 6 + 3) * 2),
           *(undefined8 *)(&i_1 + (long)(local_1e0 * 6 + 4) * 2),
           *(undefined8 *)(&i_1 + (long)(local_1e0 * 6 + 5) * 2));
  }
  for (local_1e4 = 0; local_1e4 < 5; local_1e4 = local_1e4 + 1) {
    printf("%f ",(double)local_1e4 * 1.570796326794895);
  }
  printf("\n");
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
  double q[6] = {0.0, 0.0, 1.0, 0.0, 1.0, 0.0};
  double* T = new double[16];
  forward(q, T);
  for(int i=0;i<4;i++) {
    for(int j=i*4;j<(i+1)*4;j++)
      printf("%1.3f ", T[j]);
    printf("\n");
  }
  double q_sols[8*6];
  int num_sols;
  num_sols = inverse(T, q_sols);
  for(int i=0;i<num_sols;i++)
    printf("%1.6f %1.6f %1.6f %1.6f %1.6f %1.6f\n",
       q_sols[i*6+0], q_sols[i*6+1], q_sols[i*6+2], q_sols[i*6+3], q_sols[i*6+4], q_sols[i*6+5]);
  for(int i=0;i<=4;i++)
    printf("%f ", PI/2.0*i);
  printf("\n");
  return 0;
}